

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int cm_expat_XML_SetEncoding(XML_Parser parser,XML_Char *encodingName)

{
  XML_Char *pXVar1;
  
  if (encodingName == (XML_Char *)0x0) {
    *(undefined8 *)((long)parser + 0x1c0) = 0;
  }
  else {
    pXVar1 = poolCopyString((STRING_POOL *)((long)parser + 0x418),encodingName);
    *(XML_Char **)((long)parser + 0x1c0) = pXVar1;
    if (pXVar1 == (XML_Char *)0x0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int XML_SetEncoding(XML_Parser parser, const XML_Char *encodingName)
{
  if (!encodingName)
    protocolEncodingName = 0;
  else {
    protocolEncodingName = poolCopyString(&tempPool, encodingName);
    if (!protocolEncodingName)
      return 0;
  }
  return 1;
}